

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  unsigned_short max;
  unsigned_short max_00;
  unsigned_short uVar4;
  long lVar5;
  server_connection *server;
  char *pcVar6;
  thread *ptVar7;
  thread send_game;
  thread send_gui;
  thread recv_gui;
  thread recv_game;
  _Head_base<1UL,_bool,_false> local_a8;
  _Alloc_hider a_Stack_a0 [4];
  int off;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  server_address;
  
  session_id = time((time_t *)0x0);
  if (argc < 3) {
    puts(&DAT_001082f0);
    exit(1);
  }
  pcVar6 = argv[1];
  sVar3 = strlen(pcVar6);
  if (0x40 < sVar3) {
    util::fatal("Given player name (%s) is longer than 64 chars\n",pcVar6);
    pcVar6 = argv[1];
  }
  std::__cxx11::string::string((string *)&server_address,pcVar6,(allocator *)&recv_game);
  std::__cxx11::string::operator=((string *)&player_name_abi_cxx11_,(string *)&server_address);
  std::__cxx11::string::~string((string *)&server_address);
  iVar2 = std::__cxx11::string::compare((char *)&player_name_abi_cxx11_);
  if (iVar2 == 0) {
    std::__cxx11::string::assign((char *)&player_name_abi_cxx11_);
  }
  std::__cxx11::string::string((string *)&recv_game,argv[2],(allocator *)&recv_gui);
  anon_unknown.dwarf_9299::split_hostname(&server_address,(string *)&recv_game);
  std::__cxx11::string::~string((string *)&recv_game);
  uVar4 = (short)&server_address + 0x28;
  std::__cxx11::string::_M_assign((string *)&servers[0].hostname);
  if (server_address.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .
      super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .super__Head_base<1UL,_bool,_false>._M_head_impl == true) {
    servers[0].port =
         anon_unknown.dwarf_9299::parse<unsigned_short>
                   (server_address.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<1UL,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p,uVar4,max);
  }
  if (argc != 3) {
    std::__cxx11::string::string((string *)&recv_gui,argv[3],(allocator *)&send_game);
    anon_unknown.dwarf_9299::split_hostname
              ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&recv_game,(string *)&recv_gui);
    std::__cxx11::string::~string((string *)&recv_gui);
    uVar4 = (unsigned_short)a_Stack_a0;
    std::__cxx11::string::_M_assign((string *)&servers[1].hostname);
    if (local_a8._M_head_impl == true) {
      servers[1].port =
           anon_unknown.dwarf_9299::parse<unsigned_short>
                     ((char *)recv_game._M_id._M_thread,uVar4,max_00);
    }
    std::
    _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~_Tuple_impl((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&recv_game);
  }
  lVar5 = 0;
  do {
    if (lVar5 == 400) {
      off = 1;
      iVar2 = setsockopt(servers[1].socket,6,1,&off,4);
      if (iVar2 < 0) {
        util::fatal("Couldn\'t turn off Nagle\'s algorithm");
      }
      std::thread::thread<void(&)(),,void>(&recv_game,receive_game_job);
      std::thread::thread<void(&)(),,void>(&recv_gui,receive_gui_job);
      std::thread::thread<void(&)(),,void>(&send_game,send_game_job);
      std::thread::thread<void(&)(),,void>(&send_gui,send_gui_job);
      std::thread::join();
      std::thread::join();
      std::thread::join();
      std::thread::join();
      std::thread::~thread(&send_gui);
      std::thread::~thread(&send_game);
      std::thread::~thread(&recv_gui);
      std::thread::~thread(&recv_game);
      std::
      _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~_Tuple_impl(&server_address.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
      return 0;
    }
    pcVar6 = servers[0].addr.__ss_padding + lVar5 + -10;
    std::__cxx11::to_string((string *)&recv_gui,(uint)*(ushort *)((long)&servers[0].port + lVar5));
    recv_game._M_id._M_thread = (id)0;
    a_Stack_a0[0]._M_p = (pointer)0x0;
    iVar2 = getaddrinfo(*(char **)((long)&servers[0].hostname._M_dataplus._M_p + lVar5),
                        (char *)recv_gui._M_id._M_thread,(addrinfo *)&recv_game,
                        (addrinfo **)&send_game);
    ptVar7 = &send_game;
    if (iVar2 != 0) {
      util::fatal("Couldn\'t resolve %s",
                  *(undefined8 *)((long)&servers[0].hostname._M_dataplus._M_p + lVar5));
      ptVar7 = &send_game;
    }
    while (lVar1 = *(long *)ptVar7, lVar1 != 0) {
      iVar2 = socket(*(int *)(lVar1 + 4),*(int *)(lVar1 + 8),*(int *)(lVar1 + 0xc));
      *(int *)pcVar6 = iVar2;
      if (iVar2 == -1) {
        perror("socket");
      }
      else {
        iVar2 = connect(iVar2,*(sockaddr **)(lVar1 + 0x18),*(socklen_t *)(lVar1 + 0x10));
        if (iVar2 != -1) {
          memcpy(servers[0].addr.__ss_padding + lVar5 + -2,*(void **)(lVar1 + 0x18),
                 (ulong)*(uint *)(lVar1 + 0x10));
          *(ulong *)((long)(&servers[0].addr + 1) + lVar5) = (ulong)*(uint *)(lVar1 + 0x10);
          *(undefined4 *)((long)&servers[0].family + lVar5) = *(undefined4 *)(lVar1 + 4);
          *(undefined4 *)((long)&servers[0].protocol + lVar5) = *(undefined4 *)(lVar1 + 0xc);
          goto LAB_00104057;
        }
        perror("connect");
        close(*(int *)pcVar6);
      }
      ptVar7 = (thread *)(lVar1 + 0x28);
    }
    util::fatal("Couldn\'t establish a connection to %s:%hu",
                *(undefined8 *)((long)&servers[0].hostname._M_dataplus._M_p + lVar5),
                (ulong)*(ushort *)((long)&servers[0].port + lVar5));
LAB_00104057:
    freeaddrinfo((addrinfo *)send_game._M_id._M_thread);
    std::__cxx11::string::~string((string *)&recv_gui);
    lVar5 = lVar5 + 200;
  } while( true );
}

Assistant:

int main(int argc, const char* argv[])
{
	session_id = static_cast<std::uint64_t>(time(nullptr));

	if (argc < 3)
	{
		printf(usage_msg);
		std::exit(1);
	}

	if (strlen(argv[1]) > 64)
		util::fatal("Given player name (%s) is longer than 64 chars\n", argv[1]);

	player_name = std::string(argv[1]);
	if (player_name.compare("\"\"") == 0)
		player_name = "";

	// Split to get optional port, server host will be validated later with getaddrinfo()
	auto server_address = split_hostname(argv[2]);
	game_server.hostname = std::get<0>(server_address);
	if (std::get<1>(server_address))
	{
		game_server.port = parse<std::uint16_t>(std::get<2>(server_address).data(), 0, 65535);
	}
	// Ditto optionally for ui server hostname
	if (argc >= 4)
	{
		auto server_address = split_hostname(argv[3]);
		gui_server.hostname = std::get<0>(server_address);
		if (std::get<1>(server_address))
		{
			gui_server.port = parse<std::uint16_t>(std::get<2>(server_address).data(), 0, 65535);
		}
	}


#ifdef _WIN32
	WORD wVersionRequested;
	WSADATA wsaData;

	/* Use the MAKEWORD(lowbyte, highbyte) macro declared in Windef.h */
	wVersionRequested = MAKEWORD(2, 2);

	int err = WSAStartup(wVersionRequested, &wsaData);
	if (err != 0) {
		/* Tell the user that we could not find a usable */
		/* Winsock DLL.                                  */
		printf("WSAStartup failed with error: %d\n", err);
		return 1;
	}
#define close closesocket
#endif

	// Try to create sockets and connect via either IPv4 or IPv6 to game and ui server
	for (auto& server : servers)
	{
		const auto port = std::to_string(server.port);

		addrinfo hints, *res;
		memset(&hints, 0x00, sizeof(hints));
		hints.ai_socktype = server.desired_socktype;

		int error = getaddrinfo(server.hostname.c_str(), port.c_str(), &hints, &res);
		if (error != 0)
			util::fatal("Couldn't resolve %s", server.hostname.c_str());

		addrinfo* p;
		for (p = res; p != nullptr; p = p->ai_next)
		{
			auto& sock = server.socket;
			if ((sock = socket(p->ai_family, p->ai_socktype, p->ai_protocol)) == -1)
			{
				perror("socket");
				continue;
			}

			if (connect(sock, p->ai_addr, p->ai_addrlen) == -1)
			{
				perror("connect");
				close(sock);
				continue;
			}

			memcpy(&server.addr, p->ai_addr, p->ai_addrlen);
			server.addrlen = p->ai_addrlen;
			server.family = p->ai_family;
			server.protocol = p->ai_protocol;
			break;
		}

		if (p == nullptr)
			util::fatal("Couldn't establish a connection to %s:%hu", server.hostname.c_str(), server.port);

		freeaddrinfo(res);
	}

	// Turn off Nagle's algorithm for GUI TCP connection
	int off = 1;
	int result = setsockopt(gui_server.socket, IPPROTO_TCP, TCP_NODELAY, (const char*)&off, sizeof(off));
	if (result < 0)
		util::fatal("Couldn't turn off Nagle's algorithm");

	// TODO: Implement server<>client and client<>GUI communication
	std::thread recv_game(receive_game_job);
	std::thread recv_gui(receive_gui_job);
	std::thread send_game(send_game_job);
	std::thread send_gui(send_gui_job);

	recv_game.join();
	recv_gui.join();
	send_game.join();
	send_gui.join();

	return 0;
}